

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O2

xmlStreamCtxtPtr xmlPatternGetStreamCtxt(xmlPatternPtr comp)

{
  xmlStreamCompPtr pxVar1;
  xmlStreamCtxtPtr pxVar2;
  xmlStreamCtxtPtr pxVar3;
  xmlStreamCtxtPtr stream;
  
  if ((comp == (xmlPatternPtr)0x0) || (comp->stream == (xmlStreamCompPtr)0x0)) {
LAB_0016b771:
    stream = (xmlStreamCtxtPtr)0x0;
  }
  else {
    stream = (xmlStreamCtxtPtr)0x0;
    for (; comp != (xmlPatternPtr)0x0; comp = comp->next) {
      pxVar1 = comp->stream;
      if (pxVar1 == (xmlStreamCompPtr)0x0) {
LAB_0016b769:
        xmlFreeStreamCtxt(stream);
        goto LAB_0016b771;
      }
      pxVar2 = (xmlStreamCtxtPtr)(*xmlMalloc)(0x30);
      if (pxVar2 == (xmlStreamCtxtPtr)0x0) goto LAB_0016b769;
      pxVar2->next = (_xmlStreamCtxt *)0x0;
      pxVar2->comp = (xmlStreamCompPtr)0x0;
      pxVar2->states = (int *)0x0;
      pxVar2->flags = 0;
      pxVar2->blockLevel = 0;
      pxVar2->nbState = 0;
      pxVar2->maxState = 0;
      *(undefined8 *)&pxVar2->level = 0;
      pxVar2->comp = pxVar1;
      pxVar2->blockLevel = -1;
      pxVar3 = pxVar2;
      if (stream != (xmlStreamCtxtPtr)0x0) {
        pxVar2->next = stream->next;
        stream->next = pxVar2;
        pxVar3 = stream;
      }
      pxVar2->flags = comp->flags;
      stream = pxVar3;
    }
  }
  return stream;
}

Assistant:

xmlStreamCtxtPtr
xmlPatternGetStreamCtxt(xmlPatternPtr comp)
{
    xmlStreamCtxtPtr ret = NULL, cur;

    if ((comp == NULL) || (comp->stream == NULL))
        return(NULL);

    while (comp != NULL) {
        if (comp->stream == NULL)
	    goto failed;
	cur = xmlNewStreamCtxt(comp->stream);
	if (cur == NULL)
	    goto failed;
	if (ret == NULL)
	    ret = cur;
	else {
	    cur->next = ret->next;
	    ret->next = cur;
	}
	cur->flags = comp->flags;
	comp = comp->next;
    }
    return(ret);
failed:
    xmlFreeStreamCtxt(ret);
    return(NULL);
}